

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexMatch.cpp
# Opt level: O0

void __thiscall oout::RegexMatch::RegexMatch(RegexMatch *this,string *re)

{
  string *re_local;
  RegexMatch *this_local;
  
  Match::Match(&this->super_Match);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__RegexMatch_00325420;
  std::__cxx11::string::string((string *)&this->re,(string *)re);
  return;
}

Assistant:

RegexMatch::RegexMatch(const string &re)
	: re(re)
{
}